

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  basic_format_parse_context<char,_fmt::v6::internal::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char> *pbVar3;
  uint index;
  unsigned_long_long uVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *message;
  byte *pbVar7;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *psVar8;
  basic_string_view<char> name;
  format_arg arg;
  error_handler local_79;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_78;
  int local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  precision_checker<fmt::v6::internal::error_handler> local_50;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar8 = handler->handler;
    pbVar2 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ).parse_context_;
    index = pbVar2->next_arg_id_;
    if ((int)index < 0) {
      error_handler::on_error
                ((error_handler *)pbVar2,"cannot switch from manual to automatic argument indexing")
      ;
    }
    pbVar3 = (psVar8->
             super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             ).context_;
    pbVar2->next_arg_id_ = index + 1;
LAB_0012e235:
    basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::do_get((format_arg *)&local_78.string,&pbVar3->args_,index);
    if (local_68 == 1) {
      local_78.string.size = *(size_t *)(local_78.long_long_value + 0x18);
      local_68 = *(int *)(local_78.long_long_value + 0x20);
      local_78.long_long_value = *(long *)(local_78.long_long_value + 0x10);
    }
    if (local_68 != 0) {
      local_38 = CONCAT44(uStack_64,local_68);
      local_48.long_long_value = local_78.long_long_value;
      local_48.string.size = local_78.string.size;
      uStack_30 = uStack_60;
      local_50.handler_ = &local_79;
      uVar4 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                        (&local_50,
                         (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_48.string);
      if ((uVar4 & 0xffffffff80000000) == 0) {
        ((psVar8->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->precision = (int)uVar4;
        return (char *)(byte *)begin;
      }
LAB_0012e3e1:
      error_handler::on_error(&local_79,"number is too big");
    }
    message = "argument index out of range";
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      index = 0;
      pbVar6 = (byte *)begin;
      if (bVar1 != 0x30) {
        do {
          if (0xccccccc < index) goto LAB_0012e3d8;
          index = ((uint)bVar1 + index * 10) - 0x30;
          begin = end;
          if (pbVar6 == (byte *)end) break;
          bVar1 = *pbVar6;
          begin = (char *)pbVar6;
          pbVar6 = pbVar6 + 1;
        } while ((byte)(bVar1 - 0x30) < 10);
        if ((int)index < 0) {
LAB_0012e3d8:
          message = "number is too big";
          goto LAB_0012e40e;
        }
      }
      if ((begin != end) && ((*begin == 0x3a || (*begin == 0x7d)))) {
        psVar8 = handler->handler;
        pbVar2 = (psVar8->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).parse_context_;
        if (0 < pbVar2->next_arg_id_) {
          error_handler::on_error
                    ((error_handler *)pbVar2,
                     "cannot switch from automatic to manual argument indexing");
        }
        pbVar2->next_arg_id_ = -1;
        pbVar3 = (psVar8->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).context_;
        goto LAB_0012e235;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar6 = (byte *)(begin + 1);
      do {
        pbVar5 = pbVar6;
        pbVar7 = (byte *)end;
        if (pbVar5 == (byte *)end) break;
        bVar1 = *pbVar5;
        pbVar6 = pbVar5 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar7 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar7 - (long)begin;
      psVar8 = handler->handler;
      name.data_ = begin;
      basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
                ((format_arg *)&local_78.string,
                 (psVar8->
                 super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                 ).context_,name);
      local_38 = CONCAT44(uStack_64,local_68);
      local_48.long_long_value = local_78.long_long_value;
      local_48.string.size = local_78.string.size;
      uStack_30 = uStack_60;
      local_50.handler_ = &local_79;
      uVar4 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                        (&local_50,
                         (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_48.string);
      if ((uVar4 & 0xffffffff80000000) == 0) {
        ((psVar8->
         super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->precision = (int)uVar4;
        return (char *)pbVar7;
      }
      goto LAB_0012e3e1;
    }
    message = "invalid format string";
  }
LAB_0012e40e:
  error_handler::on_error((error_handler *)&local_48.string,message);
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}